

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoWidget.cpp
# Opt level: O3

void __thiscall PianoWidget::paintEvent(PianoWidget *this,QPaintEvent *event)

{
  long lVar1;
  byte bVar2;
  Pixmaps PVar3;
  undefined1 *puVar4;
  QPixmap *pQVar5;
  int iVar6;
  int iVar7;
  QPainter painter;
  undefined1 auStack_58 [8];
  qreal local_50 [3];
  undefined8 local_38;
  undefined4 uStack_30;
  undefined2 uStack_2c;
  undefined2 uStack_2a;
  
  bVar2 = 0;
  iVar7 = 0;
  iVar6 = 0;
  if (this->mIsKeyDown == true) {
    iVar6 = (this->mNote / 0xc) * 0x54;
    lVar1 = (long)(this->mNote % 0xc);
    bVar2 = PianoWidgetTU::KEY_INFO[lVar1 * 8];
    iVar7 = *(int *)(PianoWidgetTU::KEY_INFO + lVar1 * 8 + 4);
  }
  puVar4 = &this->field_0x10;
  QPainter::QPainter((QPainter *)auStack_58,(QPaintDevice *)puVar4);
  getPixmap((PianoWidget *)local_50,(Pixmaps)puVar4);
  pQVar5 = (QPixmap *)&local_38;
  local_38._0_4_ = 0;
  local_38._4_4_ = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  uStack_2a = 0;
  QPainter::drawPixmap((QPointF *)auStack_58,pQVar5);
  PVar3 = (Pixmaps)pQVar5;
  QPixmap::~QPixmap((QPixmap *)local_50);
  if (((~this->mIsKeyDown | bVar2) & 1) == 0) {
    getPixmap((PianoWidget *)local_50,PVar3);
    local_38 = (double)(iVar6 + iVar7);
    pQVar5 = (QPixmap *)&local_38;
    uStack_30 = 0;
    uStack_2c = 0;
    uStack_2a = 0;
    QPainter::drawPixmap((QPointF *)auStack_58,pQVar5);
    PVar3 = (Pixmaps)pQVar5;
    QPixmap::~QPixmap((QPixmap *)local_50);
  }
  getPixmap((PianoWidget *)local_50,PVar3);
  pQVar5 = (QPixmap *)&local_38;
  local_38._0_4_ = 0;
  local_38._4_4_ = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  uStack_2a = 0;
  QPainter::drawPixmap((QPointF *)auStack_58,pQVar5);
  PVar3 = (Pixmaps)pQVar5;
  QPixmap::~QPixmap((QPixmap *)local_50);
  if ((bVar2 & this->mIsKeyDown) == 1) {
    getPixmap((PianoWidget *)local_50,PVar3);
    local_38 = (double)(iVar6 + iVar7);
    uStack_30 = 0;
    uStack_2c = 0;
    uStack_2a = 0;
    QPainter::drawPixmap((QPointF *)auStack_58,(QPixmap *)&local_38);
    QPixmap::~QPixmap((QPixmap *)local_50);
  }
  if ((*(byte *)(*(long *)&this->field_0x20 + 8) & 1) != 0) {
    QPainter::setCompositionMode((CompositionMode)auStack_58);
    lVar1 = *(long *)&this->field_0x20;
    local_50[1]._0_4_ = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
    local_50[1]._4_4_ = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
    local_50[0] = 0.0;
    local_38._0_4_ = 1;
    local_38._4_4_ = 0x8080ffff;
    uStack_30 = 0x80808080;
    uStack_2c = 0;
    QPainter::fillRect((QRect *)auStack_58,(QColor *)local_50);
  }
  QPainter::~QPainter((QPainter *)auStack_58);
  return;
}

Assistant:

void PianoWidget::paintEvent(QPaintEvent *event) {
    (void)event;

    int octaveOffset = 0;
    TU::KeyPaintInfo keyInfo{ false, 0 };

    if (mIsKeyDown) {
        octaveOffset = mNote / 12;
        int keyInOctave = mNote % 12;
        octaveOffset *= TU::N_WHITEKEYS * TU::WKEY_WIDTH;

        keyInfo = TU::KEY_INFO[keyInOctave];
    }

    QPainter painter(this);
    painter.drawPixmap(0, 0, getPixmap(PixWhiteKeys));
    
    if (mIsKeyDown && !keyInfo.isBlack) {
        painter.drawPixmap(octaveOffset + keyInfo.xoffset, 0, getPixmap(PixWhiteKeyDown));
    }

    painter.drawPixmap(0, 0, getPixmap(PixBlackKeys));

    if (mIsKeyDown && keyInfo.isBlack) {
        painter.drawPixmap(octaveOffset + keyInfo.xoffset, 0, getPixmap(PixBlackKeyDown));
    }

    if (!isEnabled()) {
        painter.setCompositionMode(QPainter::CompositionMode_Plus);
        painter.fillRect(rect(), QColor(128, 128, 128));
    }

}